

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mch.c
# Opt level: O2

uchar * mchalo(errcxdef *ctx,size_t siz,char *comment)

{
  uchar *puVar1;
  
  puVar1 = (uchar *)malloc(siz);
  if (puVar1 != (uchar *)0x0) {
    return puVar1;
  }
  errsigf(ctx,"TADS",1);
}

Assistant:

uchar *mchalo(errcxdef *ctx, size_t siz, char *comment)
{
    uchar *ret;

    VARUSED(comment);
    IF_DEBUG(mchtotmem += siz;)

    ret = (uchar *)osmalloc(siz);
    if (ret)
        return(ret);
    else
    {
        errsig(ctx, ERR_NOMEM);
        NOTREACHEDV(uchar *);
        return 0;
    }
}